

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

void TR_ARITH(ast *node,C_OP *place)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 *puVar4;
  InterCode *pIVar5;
  int iVar6;
  ast *node_00;
  IrSim *this;
  Operand label2;
  Operand label1;
  Operand t2;
  Operand t1;
  InterCode local_250;
  Operand local_1b8;
  undefined1 local_188 [56];
  char *local_150;
  _Alloc_hider local_148;
  char local_140 [8];
  char local_138 [32];
  _Alloc_hider local_118;
  char local_108 [32];
  char *local_e8;
  char local_d8 [24];
  InterCode local_c0;
  
  iVar6 = IrSim::ast2ic((IrSim *)node,node);
  if ((iVar6 - 0x14U < 8) || (iVar6 == 0xe)) {
    IrSim::newLabel((Operand *)local_188,&irSim);
    IrSim::newLabel(&local_1b8,&irSim);
    IrSim::icUnaryOp(&local_250,&irSim,5,place,&OP_ZERO);
    IrSim::commitIc(&irSim,&local_250);
    paVar3 = &local_250.arg2.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.arg2.value._M_dataplus._M_p != paVar3) {
      operator_delete(local_250.arg2.value._M_dataplus._M_p);
    }
    paVar1 = &local_250.arg1.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.arg1.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_250.arg1.value._M_dataplus._M_p);
    }
    paVar2 = &local_250.target.value.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.target.value._M_dataplus._M_p != paVar2) {
      operator_delete(local_250.target.value._M_dataplus._M_p);
    }
    TR_Cond(node,(C_OP *)local_188,&local_1b8);
    IrSim::icNoOp(&local_250,&irSim,0x10,(C_OP *)local_188);
    IrSim::commitIc(&irSim,&local_250);
    IrSim::icUnaryOp(&local_c0,&irSim,5,place,&OP_ONE);
    IrSim::commitIc(&irSim,&local_c0);
    IrSim::icNoOp((InterCode *)(local_188 + 0x30),&irSim,0x10,&local_1b8);
    IrSim::commitIc(&irSim,(C_IC *)(local_188 + 0x30));
    if (local_e8 != local_d8) {
      operator_delete(local_e8);
    }
    if (local_118._M_p != local_108) {
      operator_delete(local_118._M_p);
    }
    if (local_148._M_p != local_138) {
      operator_delete(local_148._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.arg2.value._M_dataplus._M_p != &local_c0.arg2.value.field_2) {
      operator_delete(local_c0.arg2.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.arg1.value._M_dataplus._M_p != &local_c0.arg1.value.field_2) {
      operator_delete(local_c0.arg1.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.target.value._M_dataplus._M_p != &local_c0.target.value.field_2) {
      operator_delete(local_c0.target.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.arg2.value._M_dataplus._M_p != paVar3) {
      operator_delete(local_250.arg2.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.arg1.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_250.arg1.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.target.value._M_dataplus._M_p != paVar2) {
      operator_delete(local_250.target.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.value._M_dataplus._M_p != &local_1b8.value.field_2) {
      operator_delete(local_1b8.value._M_dataplus._M_p);
    }
    pIVar5 = (InterCode *)local_188;
  }
  else {
    IrSim::newTmpVar((Operand *)&local_c0,&irSim);
    IrSim::newTmpVar((Operand *)(local_188 + 0x30),&irSim);
    node_00 = sibling(node,-1);
    TR_Exp(node_00,(C_OP *)&local_c0);
    this = (IrSim *)sibling(node,1);
    TR_Exp((ast *)this,(C_OP *)(local_188 + 0x30));
    iVar6 = IrSim::ast2ic(this,node);
    IrSim::icBinOp(&local_250,&irSim,iVar6,place,(C_OP *)&local_c0,(C_OP *)(local_188 + 0x30));
    IrSim::commitIc(&irSim,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.arg2.value._M_dataplus._M_p != &local_250.arg2.value.field_2) {
      operator_delete(local_250.arg2.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.arg1.value._M_dataplus._M_p != &local_250.arg1.value.field_2) {
      operator_delete(local_250.arg1.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.target.value._M_dataplus._M_p != &local_250.target.value.field_2) {
      operator_delete(local_250.target.value._M_dataplus._M_p);
    }
    if (local_150 != local_140) {
      operator_delete(local_150);
    }
    pIVar5 = &local_c0;
  }
  puVar4 = *(undefined1 **)&pIVar5->target;
  if ((size_type *)puVar4 != &(pIVar5->target).value._M_string_length) {
    operator_delete(puVar4);
  }
  return;
}

Assistant:

static void TR_ARITH(ast *node, C_OP &place) {
    int type = irSim.ast2ic(node);
    if (irSim.isGoto(type)) {
        Operand label1 = irSim.newLabel(), label2 = irSim.newLabel();
        irSim << irSim.icAssign(place, OP_ZERO);
        TR_Cond(node, label1, label2);
        irSim << irSim.icLabel(label1) << irSim.icAssign(place, OP_ONE) << irSim.icLabel(label2);
        return;
    }
    Operand t1 = irSim.newTmpVar(), t2 = irSim.newTmpVar();
    TR_Exp(sibling(node, -1), t1);
    TR_Exp(sibling(node, 1), t2);
    irSim << irSim.icArith(node, place, t1, t2);
}